

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

HttpClient * __thiscall
kj::anon_unknown_31::NetworkHttpClient::getClient(NetworkHttpClient *this,Url *parsed)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  _Base_ptr *pp_Var6;
  TransformPromiseNodeBase *pTVar7;
  PromiseNetworkAddressHttpClient *pPVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  char *pcVar11;
  _Link_type other;
  Network *pNVar12;
  _Base_ptr p_Var13;
  _Link_type __p;
  undefined8 uVar14;
  _Base_ptr *pp_Var15;
  Fault f;
  Host local_e8;
  iterator local_c0;
  Host host;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3896:17),_kj::Own<kj::NetworkAddress>_>
  promise;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::_::PromiseNode> local_48;
  String *local_38;
  
  f.exception = (Exception *)anon_var_dwarf_1edd28;
  bVar4 = String::operator==(&parsed->scheme,(StringPtr *)&f);
  f.exception = (Exception *)0x32c695;
  bVar5 = String::operator==(&parsed->scheme,(StringPtr *)&f);
  if ((!bVar4) && (!bVar5)) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xf22,FAILED,"isHttp || isHttps","");
    _::Debug::Fault::fatal(&f);
  }
  local_c0._M_node = (_Base_ptr)&this->httpHosts;
  if (bVar4) {
    local_c0._M_node = (_Base_ptr)&this->httpsHosts;
  }
  if ((parsed->host).content.size_ == 0) {
    f.exception = (Exception *)0x33812f;
  }
  else {
    f.exception = (Exception *)(parsed->host).content.ptr;
  }
  local_38 = &parsed->host;
  p_Var1 = (_Rb_tree_header *)&(local_c0._M_node)->_M_parent;
  pp_Var15 = &(local_c0._M_node)->_M_left;
  pp_Var6 = pp_Var15;
  p_Var10 = (_Rb_tree_node_base *)p_Var1;
  while (p_Var9 = *pp_Var6, p_Var9 != (_Rb_tree_node_base *)0x0) {
    bVar5 = StringPtr::operator<((StringPtr *)(p_Var9 + 1),(StringPtr *)&f);
    if (!bVar5) {
      p_Var10 = p_Var9;
    }
    pp_Var6 = &p_Var9->_M_left + bVar5;
  }
  if ((_Rb_tree_header *)p_Var10 != p_Var1) {
    bVar5 = StringPtr::operator<((StringPtr *)&f,(StringPtr *)(p_Var10 + 1));
    if (!bVar5) goto LAB_002bc4db;
  }
  if (bVar4) {
    pNVar12 = (this->tlsNetwork).ptr;
    uVar14 = 0x1bb;
    if (pNVar12 == (Network *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xf34,FAILED,"tlsNetwork != nullptr","\"this HttpClient doesn\'t support HTTPS\"",
                 (char (*) [38])"this HttpClient doesn\'t support HTTPS");
      _::Debug::Fault::fatal(&f);
    }
  }
  else {
    pNVar12 = this->network;
    uVar14 = 0x50;
  }
  sVar2 = (parsed->host).content.size_;
  if (sVar2 == 0) {
    pcVar11 = "";
  }
  else {
    pcVar11 = (parsed->host).content.ptr;
  }
  (**pNVar12->_vptr_Network)(&local_58,pNVar12,pcVar11,sVar2 + (sVar2 == 0),uVar14);
  pTVar7 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar7,&local_58,
             _::
             TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,_kj::Own<kj::NetworkAddress>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3896:17),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (pTVar7->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042af00;
  pTVar7[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
  f.exception = (Exception *)
                &_::
                 HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,kj::Own<kj::NetworkAddress>,kj::(anonymous_namespace)::NetworkHttpClient::getClient(kj::Url&)::{lambda(kj::Own<kj::NetworkAddress>)#1},kj::_::PropagateException>>
                 ::instance;
  host.name.content.ptr =
       (char *)&_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,kj::Own<kj::NetworkAddress>,kj::(anonymous_namespace)::NetworkHttpClient::getClient(kj::Url&)::{lambda(kj::Own<kj::NetworkAddress>)#1},kj::_::PropagateException>>
                ::instance;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,kj::Own<kj::NetworkAddress>,kj::(anonymous_namespace)::NetworkHttpClient::getClient(kj::Url&)::{lambda(kj::Own<kj::NetworkAddress>)#1},kj::_::PropagateException>>
        ::instance;
  host.name.content.size_ = 0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)pTVar7;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&host);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
  Own<kj::_::PromiseNode>::dispose(&local_58);
  host.name.content.ptr = (parsed->host).content.ptr;
  host.name.content.size_ = (parsed->host).content.size_;
  host.name.content.disposer = (parsed->host).content.disposer;
  (local_38->content).ptr = (char *)0x0;
  (local_38->content).size_ = 0;
  pPVar8 = (PromiseNetworkAddressHttpClient *)operator_new(0x30);
  local_48.ptr = promise.super_PromiseBase.node.ptr;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  local_48.disposer = promise.super_PromiseBase.node.disposer;
  (pPVar8->super_HttpClient)._vptr_HttpClient = (_func_int **)&PTR_request_0042af88;
  pTVar7 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar7,&local_48,
             _::
             TransformPromiseNode<kj::_::Void,_kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3735:30),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (pTVar7->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042afc8;
  pTVar7[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pPVar8;
  f.exception = (Exception *)
                &_::
                 HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::PromiseNetworkAddressHttpClient(kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>>)::{lambda(kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>&&)#1},kj::_::PropagateException>>
                 ::instance;
  local_58.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::PromiseNetworkAddressHttpClient(kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>>)::{lambda(kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_68.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::PromiseNetworkAddressHttpClient(kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>>)::{lambda(kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_58.ptr = (PromiseNode *)0x0;
  local_68.ptr = (PromiseNode *)pTVar7;
  Own<kj::_::PromiseNode>::dispose(&local_58);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
  Promise<void>::fork((Promise<void> *)&pPVar8->promise);
  Own<kj::_::PromiseNode>::dispose(&local_68);
  (pPVar8->client).ptr.disposer = (Disposer *)0x0;
  (pPVar8->client).ptr.ptr = (NetworkAddressHttpClient *)0x0;
  pPVar8->failed = false;
  host.client.disposer =
       (Disposer *)
       &_::HeapDisposer<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient>::instance;
  host.client.ptr = pPVar8;
  Own<kj::_::PromiseNode>::dispose(&local_48);
  f.exception = (Exception *)0x33812f;
  if (host.name.content.size_ != 0) {
    f.exception = (Exception *)host.name.content.ptr;
  }
  p_Var13 = (_Base_ptr)(host.name.content.size_ + (host.name.content.size_ == 0));
  local_e8.name.content.ptr = host.name.content.ptr;
  local_e8.name.content.size_ = host.name.content.size_;
  host.name.content.ptr = (char *)0x0;
  host.name.content.size_ = 0;
  local_e8.name.content.disposer = host.name.content.disposer;
  local_e8.client.disposer = host.client.disposer;
  local_e8.client.ptr = host.client.ptr;
  host.client.ptr = (PromiseNetworkAddressHttpClient *)0x0;
  p_Var9 = (_Rb_tree_node_base *)operator_new(0x58);
  pPVar8 = local_e8.client.ptr;
  other = (_Link_type)(p_Var9 + 1);
  *(Exception **)(p_Var9 + 1) = f.exception;
  p_Var9[1]._M_parent = p_Var13;
  p_Var9[1]._M_left = (_Base_ptr)local_e8.name.content.ptr;
  p_Var9[1]._M_right = (_Base_ptr)local_e8.name.content.size_;
  local_e8.name.content.ptr = (char *)0x0;
  local_e8.name.content.size_ = 0;
  local_e8.client.ptr = (PromiseNetworkAddressHttpClient *)0x0;
  *(ArrayDisposer **)(p_Var9 + 2) = local_e8.name.content.disposer;
  p_Var9[2]._M_parent = (_Base_ptr)local_e8.client.disposer;
  p_Var9[2]._M_left = (_Base_ptr)pPVar8;
  bVar4 = true;
  p_Var13 = (_Base_ptr)p_Var1;
  while (p_Var3 = *pp_Var15, p_Var3 != (_Base_ptr)0x0) {
    bVar4 = StringPtr::operator<((StringPtr *)other,(StringPtr *)(p_Var3 + 1));
    p_Var13 = p_Var3;
    pp_Var15 = &p_Var3->_M_left + !bVar4;
  }
  p_Var10 = p_Var13;
  if (bVar4 == false) {
LAB_002bc427:
    __p = other;
    bVar4 = StringPtr::operator<((StringPtr *)(p_Var10 + 1),(StringPtr *)other);
    if (bVar4) goto LAB_002bc437;
    std::
    _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
    ::_M_drop_node((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                    *)p_Var9,__p);
    bVar4 = false;
  }
  else {
    if (p_Var13 != *(_Base_ptr *)((long)local_c0._M_node + 0x18)) {
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var13);
      goto LAB_002bc427;
    }
LAB_002bc437:
    bVar4 = true;
    bVar5 = true;
    if (p_Var1 != (_Rb_tree_header *)p_Var13) {
      bVar5 = StringPtr::operator<((StringPtr *)other,(StringPtr *)(p_Var13 + 1));
    }
    std::_Rb_tree_insert_and_rebalance(bVar5,p_Var9,p_Var13,(_Rb_tree_node_base *)p_Var1);
    *(_Base_ptr *)((long)local_c0._M_node + 0x28) =
         (_Base_ptr)((long)&(*(_Base_ptr *)((long)local_c0._M_node + 0x28))->_M_color + 1);
    p_Var10 = p_Var9;
  }
  Host::~Host(&local_e8);
  if (!bVar4) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xf44,FAILED,"insertResult.second","");
    _::Debug::Fault::fatal(&f);
  }
  handleCleanup((NetworkHttpClient *)&f,
                (map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                 *)this,local_c0);
  TaskSet::add(&this->tasks,(Promise<void> *)&f);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
  Host::~Host(&host);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
LAB_002bc4db:
  return (HttpClient *)p_Var10[2]._M_left;
}

Assistant:

HttpClient& getClient(kj::Url& parsed) {
    bool isHttps = parsed.scheme == "https";
    bool isHttp = parsed.scheme == "http";
    KJ_REQUIRE(isHttp || isHttps);

    auto& hosts = isHttps ? httpsHosts : httpHosts;

    // Look for a cached client for this host.
    // TODO(perf): It would be nice to recognize when different hosts have the same address and
    //   reuse the same connection pool, but:
    //   - We'd need a reliable way to compare NetworkAddresses, e.g. .equals() and .hashCode().
    //     It's very Java... ick.
    //   - Correctly handling TLS would be tricky: we'd need to verify that the new hostname is
    //     on the certificate. When SNI is in use we might have to request an additional
    //     certificate (is that possible?).
    auto iter = hosts.find(parsed.host);

    if (iter == hosts.end()) {
      // Need to open a new connection.
      kj::Network* networkToUse = &network;
      if (isHttps) {
        networkToUse = &KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support HTTPS");
      }

      auto promise = networkToUse->parseAddress(parsed.host, isHttps ? 443 : 80)
          .then([this](kj::Own<kj::NetworkAddress> addr) {
        return kj::heap<NetworkAddressHttpClient>(
            timer, responseHeaderTable, kj::mv(addr), settings);
      });

      Host host {
        kj::mv(parsed.host),
        kj::heap<PromiseNetworkAddressHttpClient>(kj::mv(promise))
      };
      kj::StringPtr nameRef = host.name;

      auto insertResult = hosts.insert(std::make_pair(nameRef, kj::mv(host)));
      KJ_ASSERT(insertResult.second);
      iter = insertResult.first;

      tasks.add(handleCleanup(hosts, iter));
    }

    return *iter->second.client;
  }